

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::updateAPF(HFactor *this,HVector *aq,HVector *ep,HighsInt iRow)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  int *piVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double local_58;
  vector<double,std::allocator<double>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  long local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_40 = CONCAT44(local_40._4_4_,iRow);
  if (0 < aq->packCount) {
    local_48 = (vector<int,std::allocator<int>> *)&this->pf_index;
    local_50 = (vector<double,std::allocator<double>> *)&this->pf_value;
    lVar6 = 0;
    lVar8 = 0;
    lVar9 = 0;
    do {
      piVar4 = (int *)((long)(aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar8);
      iVar2._M_current =
           (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar2,piVar4);
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pdVar5 = (double *)
               ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6);
      iVar3._M_current =
           (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_50,iVar3,pdVar5);
      }
      else {
        *iVar3._M_current = *pdVar5;
        (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 4;
      lVar6 = lVar6 + 8;
    } while (lVar9 < aq->packCount);
  }
  local_40 = (long)(int)local_40;
  iVar7 = this->basic_index[local_40];
  if (iVar7 < this->num_col) {
    iVar1 = this->a_start[iVar7];
    lVar6 = (long)iVar1;
    if (iVar1 < this->a_start[(long)iVar7 + 1]) {
      local_48 = (vector<int,std::allocator<int>> *)&this->pf_index;
      local_50 = (vector<double,std::allocator<double>> *)&this->pf_value;
      lVar8 = lVar6 * 4;
      do {
        piVar4 = (int *)((long)this->a_index + lVar8);
        iVar2._M_current =
             (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar2,piVar4)
          ;
        }
        else {
          *iVar2._M_current = *piVar4;
          (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_58 = -*(double *)((long)this->a_value + lVar8 * 2);
        iVar3._M_current =
             (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_50,iVar3,&local_58);
        }
        else {
          *iVar3._M_current = local_58;
          (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar6 < this->a_start[(long)iVar7 + 1]);
    }
  }
  else {
    iVar7 = iVar7 - this->num_col;
    local_58 = (double)CONCAT44(local_58._4_4_,iVar7);
    iVar2._M_current =
         (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->pf_index,iVar2,(int *)&local_58);
    }
    else {
      *iVar2._M_current = iVar7;
      (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar2._M_current + 1;
    }
    local_58 = -1.0;
    iVar3._M_current =
         (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->pf_value,iVar3,&local_58);
    }
    else {
      *iVar3._M_current = -1.0;
      (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
  }
  local_38 = &this->pf_start;
  iVar7 = (int)((ulong)((long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_58 = (double)CONCAT44(local_58._4_4_,iVar7);
  iVar2._M_current =
       (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_38,iVar2,(int *)&local_58);
  }
  else {
    *iVar2._M_current = iVar7;
    (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  if (0 < ep->packCount) {
    local_48 = (vector<int,std::allocator<int>> *)&this->pf_index;
    local_50 = (vector<double,std::allocator<double>> *)&this->pf_value;
    lVar8 = 0;
    lVar6 = 0;
    lVar9 = 0;
    do {
      piVar4 = (int *)((long)(ep->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar6);
      iVar2._M_current =
           (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar2,piVar4);
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pdVar5 = (double *)
               ((long)(ep->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar8);
      iVar3._M_current =
           (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_50,iVar3,pdVar5);
      }
      else {
        *iVar3._M_current = *pdVar5;
        (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + 4;
      lVar8 = lVar8 + 8;
    } while (lVar9 < ep->packCount);
  }
  iVar7 = (int)((ulong)((long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_58 = (double)CONCAT44(local_58._4_4_,iVar7);
  iVar2._M_current =
       (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_38,iVar2,(int *)&local_58);
  }
  else {
    *iVar2._M_current = iVar7;
    (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  pdVar5 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + local_40;
  iVar3._M_current =
       (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->pf_pivot_value,iVar3,pdVar5);
  }
  else {
    *iVar3._M_current = *pdVar5;
    (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return;
}

Assistant:

void HFactor::updateAPF(HVector* aq, HVector* ep, HighsInt iRow
                        //, HighsInt* hint
) {
  // Store elements
  for (HighsInt i = 0; i < aq->packCount; i++) {
    pf_index.push_back(aq->packIndex[i]);
    pf_value.push_back(aq->packValue[i]);
  }

  HighsInt variable_out = basic_index[iRow];
  if (variable_out >= num_col) {
    pf_index.push_back(variable_out - num_col);
    pf_value.push_back(-1);
  } else {
    for (HighsInt k = a_start[variable_out]; k < a_start[variable_out + 1];
         k++) {
      pf_index.push_back(a_index[k]);
      pf_value.push_back(-a_value[k]);
    }
  }
  pf_start.push_back(pf_index.size());

  for (HighsInt i = 0; i < ep->packCount; i++) {
    pf_index.push_back(ep->packIndex[i]);
    pf_value.push_back(ep->packValue[i]);
  }
  pf_start.push_back(pf_index.size());

  // Store pivot
  pf_pivot_value.push_back(aq->array[iRow]);
}